

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

RandomNormalLikeLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_randomnormallike(NeuralNetworkLayer *this)

{
  bool bVar1;
  RandomNormalLikeLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_randomnormallike(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_randomnormallike(this);
    this_00 = (RandomNormalLikeLayerParams *)operator_new(0x28);
    RandomNormalLikeLayerParams::RandomNormalLikeLayerParams(this_00);
    (this->layer_).randomnormallike_ = this_00;
  }
  return (RandomNormalLikeLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::RandomNormalLikeLayerParams* NeuralNetworkLayer::mutable_randomnormallike() {
  if (!has_randomnormallike()) {
    clear_layer();
    set_has_randomnormallike();
    layer_.randomnormallike_ = new ::CoreML::Specification::RandomNormalLikeLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.randomNormalLike)
  return layer_.randomnormallike_;
}